

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::writeQueuedControlMessage(WebSocketImpl *this)

{
  Coroutine<void> *this_00;
  undefined4 *puVar1;
  Promise<void> *promise;
  PromiseAwaiter<void> *__return_storage_ptr__;
  byte *pbVar2;
  long *plVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  long lVar7;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar8;
  coroutine_handle<void> coroutine;
  long lVar9;
  int iVar10;
  long in_RSI;
  Mask in_R9D;
  ArrayPtr<const_unsigned_char> AVar11;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  ExceptionOrValue *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x448);
  *(code **)coroutine._M_fr_ptr = writeQueuedControlMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = writeQueuedControlMessage;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "writeQueuedControlMessage";
  local_40 = 0x1500000e54;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  local_38 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "writeQueuedControlMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xe54;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_38,location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dd10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062dd58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  if (*(char *)(in_RSI + 0x310) != '\0') {
    bVar8 = *(bool *)(in_RSI + 0x318);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x410) = *(undefined8 *)(in_RSI + 800);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418) = *(undefined8 *)(in_RSI + 0x328);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x420) = *(undefined8 *)(in_RSI + 0x330);
    *(undefined8 *)(in_RSI + 800) = 0;
    *(undefined8 *)(in_RSI + 0x328) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x430) = *(undefined8 *)(in_RSI + 0x338);
    plVar3 = *(long **)(in_RSI + 0x340);
    *(long **)((long)coroutine._M_fr_ptr + 0x438) = plVar3;
    *(undefined8 *)(in_RSI + 0x340) = 0;
    *(undefined1 *)(in_RSI + 0x310) = 0;
    lVar4 = *(long *)(in_RSI + 800);
    if (lVar4 != 0) {
      uVar5 = *(undefined8 *)(in_RSI + 0x328);
      *(undefined8 *)(in_RSI + 800) = 0;
      *(undefined8 *)(in_RSI + 0x328) = 0;
      in_R9D.maskBytes[0] = '\0';
      in_R9D.maskBytes[1] = '\0';
      in_R9D.maskBytes[2] = '\0';
      in_R9D.maskBytes[3] = '\0';
      (**(code **)**(undefined8 **)(in_RSI + 0x330))
                (*(undefined8 **)(in_RSI + 0x330),lVar4,1,uVar5,uVar5);
    }
    if ((*(char *)(in_RSI + 0x160) == '\0') && (*(char *)(in_RSI + 0x161) != '\x01')) {
      puVar1 = (undefined4 *)((long)coroutine._M_fr_ptr + 0x440);
      puVar6 = *(undefined8 **)(in_RSI + 0x20);
      if (puVar6 == (undefined8 *)0x0) {
        *puVar1 = 0;
      }
      else {
        (**(code **)*puVar6)(puVar6,puVar1,4);
      }
      promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x428);
      if ((((*(char *)((long)coroutine._M_fr_ptr + 0x441) != '\0' ||
            *(char *)((long)coroutine._M_fr_ptr + 0x440) != '\0') ||
           *(char *)((long)coroutine._M_fr_ptr + 0x442) != '\0') ||
           *(char *)((long)coroutine._M_fr_ptr + 0x443) != '\0') &&
         (lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x418), lVar4 != 0)) {
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0x410);
        lVar9 = 0;
        do {
          pbVar2 = (byte *)(lVar7 + lVar9);
          *pbVar2 = *pbVar2 ^ *(byte *)((long)puVar1 + (ulong)((uint)lVar9 & 3));
          lVar9 = lVar9 + 1;
        } while (lVar4 != lVar9);
      }
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x400) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
      uVar5 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418);
      AVar11 = Header::compose((Header *)(in_RSI + 0x163),false,bVar8,(byte)uVar5,
                               (ulong)*(uint *)((long)coroutine._M_fr_ptr + 0x440),in_R9D);
      *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x3f0) = AVar11;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x400) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x410);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408) = uVar5;
      (**(code **)(*(long *)(*(long *)(in_RSI + 0x18) + 8) + 8))
                (promise,*(long *)(in_RSI + 0x18) + 8,
                 (undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0),2);
      __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
      co_await<void>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x444) = 0;
      bVar8 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar8) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      node = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (node != (PromiseArenaMember *)0x0) {
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
      plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x438);
      bVar8 = true;
      iVar10 = 0;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))(plVar3,&local_50);
        iVar10 = 0;
      }
    }
    else {
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))(plVar3,&local_50);
      }
      kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x446));
      bVar8 = false;
      iVar10 = 3;
    }
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x438);
    if (plVar3 != (long *)0x0) {
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x430))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x430),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x410);
    if (lVar4 != 0) {
      uVar5 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418);
      *(long *)((long)coroutine._M_fr_ptr + 0x410) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x420))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x420),lVar4,1,uVar5,uVar5,0);
    }
    if (!bVar8) goto LAB_003b26d7;
  }
  iVar10 = 0;
LAB_003b26d7:
  if (iVar10 != 3) {
    if (iVar10 != 0) {
      if ((local_38->exception).ptr.isSet == true) {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
      }
      kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
      operator_delete(coroutine._M_fr_ptr,0x448);
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x445));
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x444) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> writeQueuedControlMessage() {
    KJ_IF_SOME(q, queuedControlMessage) {
      byte opcode = q.opcode;
      kj::Array<byte> payload = kj::mv(q.payload);
      auto maybeFulfiller = kj::mv(q.fulfiller);
      queuedControlMessage = kj::none;

      if (hasSentClose || disconnected) {
        KJ_IF_SOME(fulfiller, maybeFulfiller) {
          fulfiller->fulfill();
        }
        co_return;
      }

      Mask mask(maskKeyGenerator);
      if (!mask.isZero()) {
        mask.apply(payload);
      }

      kj::ArrayPtr<const byte> sendParts[2];
      sendParts[0] = sendHeader.compose(true, false, opcode, payload.size(), mask);
      sendParts[1] = payload;
      co_await stream->write(sendParts);
      KJ_IF_SOME(fulfiller, maybeFulfiller) {
        fulfiller->fulfill();
      }
    }
  }